

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

uchar * kex_agree_instr(uchar *haystack,size_t haystack_len,uchar *needle,size_t needle_len)

{
  int iVar1;
  void *pvVar2;
  uchar *__s1;
  uchar *__n;
  
  if (needle_len - 1 < haystack_len && haystack != (uchar *)0x0) {
    iVar1 = strncmp((char *)haystack,(char *)needle,needle_len);
    if (iVar1 == 0) {
      if (needle_len == haystack_len) {
        return haystack;
      }
      if (haystack[needle_len] == ',') {
        return haystack;
      }
    }
    pvVar2 = memchr(haystack,0x2c,haystack_len);
    if (pvVar2 != (void *)0x0) {
      do {
        __n = haystack + (haystack_len - (long)pvVar2);
        if (__n <= needle_len) {
          return (uchar *)0x0;
        }
        if (haystack_len <= __n + -1) {
          return (uchar *)0x0;
        }
        __s1 = (uchar *)((long)pvVar2 + 1);
        iVar1 = strncmp((char *)__s1,(char *)needle,needle_len);
        if (iVar1 == 0) {
          if (__s1 + (needle_len - (long)haystack) == (uchar *)haystack_len) {
            return __s1;
          }
          if (__s1[needle_len] == ',') {
            return __s1;
          }
        }
        pvVar2 = memchr(__s1,0x2c,(size_t)__n);
        if (pvVar2 == (void *)0x0) {
          return (uchar *)0x0;
        }
      } while( true );
    }
  }
  return (uchar *)0x0;
}

Assistant:

static unsigned char *
kex_agree_instr(unsigned char *haystack, size_t haystack_len,
                const unsigned char *needle, size_t needle_len)
{
    unsigned char *s;
    unsigned char *end_haystack;
    size_t left;

    if(!haystack || !needle) {
        return NULL;
    }

    /* Haystack too short to bother trying */
    if(haystack_len < needle_len || needle_len == 0) {
        return NULL;
    }

    s = haystack;
    end_haystack = &haystack[haystack_len];
    left = end_haystack - s;

    /* Needle at start of haystack */
    if((strncmp((char *) haystack, (char *) needle, needle_len) == 0) &&
        (needle_len == haystack_len || haystack[needle_len] == ',')) {
        return haystack;
    }

    /* Search until we run out of comas or we run out of haystack,
       whichever comes first */
    /* !checksrc! disable EQUALSNULL 1 */
    while((s = (unsigned char *) memchr((char *) s, ',', left)) != NULL) {
        /* Advance buffer past coma if we can */
        left = end_haystack - s;
        if((left >= 1) && (left <= haystack_len) && (left > needle_len)) {
            s++;
        }
        else {
            return NULL;
        }

        /* Needle at X position */
        if((strncmp((char *) s, (char *) needle, needle_len) == 0) &&
            (((s - haystack) + needle_len) == haystack_len
             || s[needle_len] == ',')) {
            return s;
        }
    }

    return NULL;
}